

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O2

int RqInterGetMemSizes(int nMaxK,int nMaxExtra,size_t *pInterWorkMemSize,size_t *pInterProgMemSize,
                      size_t *pInterSymNum)

{
  int iVar1;
  long lVar2;
  parameters params;
  
  parameters_get(nMaxK);
  if (params.K == -1) {
    fprintf(_stderr,"Error:%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/api/tvrq_api.c",
            0x34,"Unsupported K value.");
    iVar1 = -2;
  }
  else {
    if (pInterWorkMemSize != (size_t *)0x0) {
      *pInterWorkMemSize = ((long)nMaxExtra + (long)params.Kprime) * 4 + 0x34;
    }
    if (pInterProgMemSize != (size_t *)0x0) {
      lVar2 = (long)params.H + (long)params.S + (long)(int)((long)nMaxExtra + (long)params.Kprime);
      *pInterProgMemSize = (long)(int)lVar2 * (long)params.L + lVar2 * 4 + 0x28;
    }
    iVar1 = 0;
    if (pInterSymNum != (size_t *)0x0) {
      *pInterSymNum = (long)params.L;
    }
  }
  return iVar1;
}

Assistant:

int RqInterGetMemSizes(int nMaxK,
		       int nMaxExtra,
		       size_t* pInterWorkMemSize,
		       size_t* pInterProgMemSize,
		       size_t* pInterSymNum)
{
	/* Compute scheduler size */
	parameters params = parameters_get(nMaxK);
	if (params.K == -1) {
		errmsg("Unsupported K value.");
		return RQ_ERR_EDOM;
	}
	const int maxISIcount = nMaxExtra + params.Kprime;
	if (pInterWorkMemSize != NULL) {
		*pInterWorkMemSize = sizeof(RqInterWorkMem)
					+ maxISIcount * sizeof(uint32_t);
	}

	/* Compute the program size */
	int n_rows = maxISIcount + params.S + params.H;
	int n_cols = params.L;
	if (pInterProgMemSize != NULL) {
		*pInterProgMemSize =
		  sizeof(RqInterProgram)
		  + sizeof(int) * n_rows
		  + n_rows * n_cols;
	}

	/* Intermediate Block Size */
	if (pInterSymNum != NULL) {
		*pInterSymNum = params.L;
	}

	return 0;
}